

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolver.hpp
# Opt level: O3

void __thiscall
soplex::SPxSolverBase<double>::setTester
          (SPxSolverBase<double> *this,SPxRatioTester<double> *x,bool destroy)

{
  SPxRatioTester<double> *pSVar1;
  element_type *local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  
  if (this->freeRatioTester == true) {
    if (this->theratiotester != (SPxRatioTester<double> *)0x0) {
      (*this->theratiotester->_vptr_SPxRatioTester[0xb])();
    }
    this->theratiotester = (SPxRatioTester<double> *)0x0;
  }
  this->theratiotester = x;
  if (x != (SPxRatioTester<double> *)0x0) {
    if (this->initialized == true) {
      (*x->_vptr_SPxRatioTester[1])(x,this);
    }
    else {
      (*x->_vptr_SPxRatioTester[2])(x);
    }
    pSVar1 = this->theratiotester;
    local_28 = (this->super_SPxLPBase<double>)._tolerances.
               super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_20 = (this->super_SPxLPBase<double>)._tolerances.
               super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_20->_M_use_count = local_20->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_20->_M_use_count = local_20->_M_use_count + 1;
      }
    }
    (*pSVar1->_vptr_SPxRatioTester[6])(pSVar1,&local_28);
    if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
    }
  }
  this->freeRatioTester = destroy;
  return;
}

Assistant:

void SPxSolverBase<R>::setTester(SPxRatioTester<R>* x, const bool destroy)
{
   assert(!freeRatioTester || theratiotester != nullptr);

   if(freeRatioTester)
   {
      delete theratiotester;
      theratiotester = nullptr;
   }

   theratiotester = x;

   // set the solver pointer inside the ratiotester
   if(theratiotester != nullptr)
   {
      if(isInitialized())
         theratiotester->load(this);
      else
         theratiotester->clear();

      theratiotester->setTolerances(this->tolerances());
   }

   freeRatioTester = destroy;
}